

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float target_y;
  float cr_y;
  float decoration_up_height;
  float target_x;
  float cr_x;
  ImGuiContext *g;
  ImVec2 scroll;
  float local_34;
  float local_28;
  ImGuiContext *this;
  ImVec2 local_8;
  
  bVar1 = in_SIL & 1;
  local_8 = *(ImVec2 *)(in_RDI + 0x54);
  if (*(float *)(in_RDI + 100) <= 3.4028235e+38 && *(float *)(in_RDI + 100) != 3.4028235e+38) {
    fVar4 = *(float *)(in_RDI + 0x6c);
    local_28 = *(float *)(in_RDI + 100);
    if (((bVar1 == 0) || (0.0 < fVar4)) || (*(float *)(in_RDI + 0x38) < local_28)) {
      if (((bVar1 != 0) && (1.0 <= fVar4)) &&
         (*(float *)(in_RDI + 0x28) + *(float *)(in_RDI + 0x38) + (GImGui->Style).ItemSpacing.x <=
          local_28)) {
        local_28 = *(float *)(in_RDI + 0x38) + *(float *)(in_RDI + 0x38) + *(float *)(in_RDI + 0x28)
        ;
      }
    }
    else {
      local_28 = 0.0;
    }
    local_8.y = (float)((ulong)local_8 >> 0x20);
    local_8.x = -fVar4 * (*(float *)(in_RDI + 0x20) - *(float *)(in_RDI + 0x74)) + local_28;
  }
  if (*(float *)(in_RDI + 0x68) <= 3.4028235e+38 && *(float *)(in_RDI + 0x68) != 3.4028235e+38) {
    this = GImGui;
    fVar2 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)GImGui);
    fVar3 = ImGuiWindow::MenuBarHeight((ImGuiWindow *)this);
    fVar4 = *(float *)(in_RDI + 0x70);
    local_34 = *(float *)(in_RDI + 0x68);
    if (((bVar1 != 0) && (fVar4 <= 0.0)) && (local_34 <= *(float *)(in_RDI + 0x3c))) {
      local_34 = 0.0;
    }
    if (((bVar1 != 0) && (1.0 <= fVar4)) &&
       (*(float *)(in_RDI + 0x2c) + *(float *)(in_RDI + 0x3c) + (this->Style).ItemSpacing.y <=
        local_34)) {
      local_34 = *(float *)(in_RDI + 0x3c) + *(float *)(in_RDI + 0x3c) + *(float *)(in_RDI + 0x2c);
    }
    local_8.y = -fVar4 * ((*(float *)(in_RDI + 0x24) - *(float *)(in_RDI + 0x78)) - (fVar2 + fVar3))
                + local_34;
  }
  fVar4 = ImMax<float>(local_8.x,0.0);
  fVar2 = ImMax<float>(local_8.y,0.0);
  local_8.y = (float)(int)fVar2;
  local_8.x = (float)(int)fVar4;
  if (((*(byte *)(in_RDI + 0x81) & 1) == 0) && ((*(byte *)(in_RDI + 0x83) & 1) == 0)) {
    local_8.x = ImMin<float>((float)(int)fVar4,*(float *)(in_RDI + 0x5c));
    local_8.y = ImMin<float>((float)(int)fVar2,*(float *)(in_RDI + 0x60));
  }
  return local_8;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}